

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O1

void __thiscall
xLearn::PARSER_TEST_Parse_libsvm_comma_Test::TestBody(PARSER_TEST_Parse_libsvm_comma_Test *this)

{
  uint64 size;
  char *buffer;
  LibsvmParser parser;
  DMatrix matrix;
  char *local_e0;
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [88];
  unkbyte9 Stack_30;
  index_t local_24;
  
  write_data((string *)&Kfilename_abi_cxx11_,(string *)kStr_comma_abi_cxx11_);
  local_e0 = (char *)0x0;
  size = ReadFileToMemory((string *)&Kfilename_abi_cxx11_,&local_e0);
  local_24 = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_4_ = 0;
  local_88._24_9_ = SUB649(ZEXT464(0) << 0x40,0);
  local_88._33_55_ = SUB6455(ZEXT464(0) << 0x40,0);
  Stack_30._0_8_ = (pointer)0x0;
  Stack_30._8_1_ = false;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_d8._0_8_ = &PTR__Parser_001563f0;
  local_d8[8] = true;
  local_c8._M_p = (pointer)&local_b8;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,",","");
  std::__cxx11::string::_M_assign((string *)&local_c8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  LibsvmParser::Parse((LibsvmParser *)local_d8,local_e0,size,(DMatrix *)local_88,true);
  check((DMatrix *)local_88,true,false);
  LibsvmParser::Parse((LibsvmParser *)local_d8,local_e0,size,(DMatrix *)local_88,false);
  check_double((DMatrix *)local_88,true,false);
  LibsvmParser::Parse((LibsvmParser *)local_d8,local_e0,size,(DMatrix *)local_88,true);
  check((DMatrix *)local_88,true,false);
  RemoveFile(Kfilename_abi_cxx11_);
  local_d8._0_8_ = &PTR__Parser_00156138;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p);
  }
  DMatrix::~DMatrix((DMatrix *)local_88);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libsvm_comma) {
  write_data(Kfilename, kStr_comma);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  LibsvmParser parser;
  parser.setLabel(true);
  parser.setSplitor(",");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, false);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, true, false);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, false);
  RemoveFile(Kfilename.c_str());
}